

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMus<(moira::Mode)10,_2> wrapper)

{
  uint uVar1;
  Syntax SVar2;
  int iVar3;
  Int i;
  char *pcVar4;
  byte *pbVar5;
  Int i_00;
  bool bVar6;
  char *pcVar7;
  uint uVar8;
  char cVar9;
  uint uVar10;
  
  uVar1 = (wrapper.ea)->ext1;
  cVar9 = (char)uVar1;
  if ((uVar1 >> 8 & 1) == 0) {
    pcVar7 = this->ptr;
    this->ptr = pcVar7 + 1;
    *pcVar7 = '(';
    if (cVar9 != '\0') {
      operator<<(this,(Int)(int)cVar9);
      pcVar7 = this->ptr;
      this->ptr = pcVar7 + 1;
      *pcVar7 = ',';
    }
    uVar8 = uVar1 >> 9 & 3;
    operator<<(this);
    pcVar7 = this->ptr;
    this->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    pcVar7 = "$%x.l";
    if ((uVar1 >> 0xb & 1) == 0) {
      pcVar7 = "$%x.w";
    }
    pcVar7 = pcVar7 + 3;
    cVar9 = *pcVar7;
    while (cVar9 != '\0') {
      pcVar7 = pcVar7 + 1;
      pcVar4 = this->ptr;
      this->ptr = pcVar4 + 1;
      *pcVar4 = cVar9;
      cVar9 = *pcVar7;
    }
    if ((uVar8 != 0) && (SVar2 = this->style->syntax, SVar2 < (MUSASHI|MOIRA_MIT))) {
      pcVar7 = this->ptr;
      this->ptr = pcVar7 + 1;
      *pcVar7 = (char)(0x2a3a2a3a2a >> ((byte)(SVar2 << 3) & 0x3f));
      pbVar5 = (byte *)this->ptr;
      this->ptr = (char *)(pbVar5 + 1);
      *pbVar5 = (byte)(1 << (sbyte)uVar8) | 0x30;
    }
  }
  else {
    iVar3 = (wrapper.ea)->ext2;
    i.raw = (wrapper.ea)->ext3;
    pcVar7 = this->ptr;
    this->ptr = pcVar7 + 1;
    if ((uVar1 & 0xe4) == 0xc4 || (uVar1 & 0xe2) == 0xc0) {
      *pcVar7 = '0';
      return this;
    }
    uVar8 = uVar1 & 7;
    *pcVar7 = '(';
    if (4 < uVar8 || uVar8 - 1 < 3) {
      pcVar7 = this->ptr;
      this->ptr = pcVar7 + 1;
      *pcVar7 = '[';
    }
    if (iVar3 == 0) {
      bVar6 = false;
    }
    else {
      i_00.raw = (int)(short)iVar3;
      if ((~uVar1 & 0x30) == 0) {
        i_00.raw = iVar3;
      }
      operator<<(this,i_00);
      bVar6 = true;
    }
    if (-1 < cVar9) {
      if (bVar6) {
        pcVar7 = this->ptr;
        this->ptr = pcVar7 + 1;
        *pcVar7 = ',';
      }
      operator<<(this);
      bVar6 = true;
    }
    if (4 < uVar8) {
      pcVar7 = this->ptr;
      this->ptr = pcVar7 + 1;
      *pcVar7 = ']';
      bVar6 = true;
    }
    if ((uVar1 & 0x40) == 0) {
      if (bVar6) {
        pcVar7 = this->ptr;
        this->ptr = pcVar7 + 1;
        *pcVar7 = ',';
      }
      uVar10 = uVar1 >> 9 & 3;
      operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
      pcVar7 = "$%x.l";
      if ((uVar1 >> 0xb & 1) == 0) {
        pcVar7 = "$%x.w";
      }
      pcVar7 = pcVar7 + 3;
      cVar9 = *pcVar7;
      while (cVar9 != '\0') {
        pcVar7 = pcVar7 + 1;
        pcVar4 = this->ptr;
        this->ptr = pcVar4 + 1;
        *pcVar4 = cVar9;
        cVar9 = *pcVar7;
      }
      bVar6 = true;
      if ((uVar10 != 0) && (SVar2 = this->style->syntax, SVar2 < (MUSASHI|MOIRA_MIT))) {
        pcVar7 = this->ptr;
        this->ptr = pcVar7 + 1;
        *pcVar7 = (char)(0x2a3a2a3a2a >> ((byte)(SVar2 << 3) & 0x3f));
        pbVar5 = (byte *)this->ptr;
        this->ptr = (char *)(pbVar5 + 1);
        *pbVar5 = (byte)(1 << (sbyte)uVar10) | 0x30;
      }
    }
    if (uVar8 - 1 < 3) {
      pcVar7 = this->ptr;
      this->ptr = pcVar7 + 1;
      *pcVar7 = ']';
      bVar6 = true;
    }
    if (i.raw != 0) {
      if (bVar6) {
        pcVar7 = this->ptr;
        this->ptr = pcVar7 + 1;
        *pcVar7 = ',';
      }
      operator<<(this,i);
    }
  }
  pcVar7 = this->ptr;
  this->ptr = pcVar7 + 1;
  *pcVar7 = ')';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMus<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(";
        if (disp) *this << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg};
        *this << (lw ? ".l" : ".w");
        *this << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        bool preindex = (iis > 0 && iis < 4);
        bool postindex = (iis > 4);
        bool effectiveZero = (ea.ext1 & 0xe4) == 0xC4 || (ea.ext1 & 0xe2) == 0xC0;
        bool comma = false;

        if (effectiveZero) {

            *this << "0";
            return *this;
        }

        *this << "(";

        if (preindex || postindex) {

            *this << "[";
        }
        if (base) {

            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
            comma = true;
        }
        if (!bs) {

            if (comma) *this << ",";
            M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
            comma = true;
        }
        if (postindex) {

            *this << "]";
            comma = true;
        }
        if (!is) {

            if (comma) *this << ",";
            *this << Rn{reg};
            *this << (lw ? ".l" : ".w");
            *this << Scale{scale};
            comma = true;
        }
        if (preindex) {

            *this << "]";
            comma = true;
        }
        if(outer)
        {
            if (comma) *this << ",";
            *this << Int(outer);
        }

        *this << ")";
    }

    return *this;
}